

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O3

void __thiscall Dinic::addEdge(Dinic *this,int a,int b,Flow cap)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  iterator iVar2;
  pointer pEVar3;
  int iVar4;
  iterator iVar5;
  Edge local_40;
  
  local_40.flow = 0;
  iVar5._M_current =
       (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_40.a = a;
  local_40.b = b;
  local_40.cap = cap;
  if (iVar5._M_current ==
      (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Edge,_std::allocator<Edge>_>::_M_realloc_insert<Edge>(&this->e,iVar5,&local_40);
    iVar5._M_current =
         (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
         _M_finish;
  }
  else {
    (iVar5._M_current)->cap = cap;
    (iVar5._M_current)->flow = 0;
    (iVar5._M_current)->a = a;
    (iVar5._M_current)->b = b;
    iVar5._M_current =
         (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
         _M_finish + 1;
    (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current;
  }
  pvVar1 = (this->g).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + a;
  iVar4 = (int)((ulong)((long)iVar5._M_current -
                       (long)(this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) * -0x55555555 + -1;
  local_40.flow = CONCAT44(local_40.flow._4_4_,iVar4);
  iVar2._M_current =
       (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,(int *)&local_40);
    iVar5._M_current =
         (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
         _M_finish;
  }
  else {
    *iVar2._M_current = iVar4;
    (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_40.flow = 0;
  local_40.cap = 0;
  local_40.a = b;
  local_40.b = a;
  if (iVar5._M_current ==
      (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Edge,_std::allocator<Edge>_>::_M_realloc_insert<Edge>(&this->e,iVar5,&local_40);
    pEVar3 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    (iVar5._M_current)->cap = 0;
    (iVar5._M_current)->flow = 0;
    (iVar5._M_current)->a = b;
    (iVar5._M_current)->b = a;
    pEVar3 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
    (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
    _M_finish = pEVar3;
  }
  pvVar1 = (this->g).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + b;
  iVar4 = (int)((ulong)((long)pEVar3 -
                       (long)(this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) * -0x55555555 + -1;
  local_40.flow = CONCAT44(local_40.flow._4_4_,iVar4);
  iVar2._M_current =
       (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,(int *)&local_40);
  }
  else {
    *iVar2._M_current = iVar4;
    (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void addEdge(int a, int b, Flow cap) {
        e.push_back(Edge(a, b, cap));
        g[a].push_back(e.size() - 1);
        e.push_back(Edge(b, a, 0));
        g[b].push_back(e.size() - 1);
    }